

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O0

void sx__coro_remove_list(sx__coro_state **pfirst,sx__coro_state **plast,sx__coro_state *node)

{
  sx__coro_state *node_local;
  sx__coro_state **plast_local;
  sx__coro_state **pfirst_local;
  
  if (node->prev != (sx__coro_state *)0x0) {
    node->prev->next = node->next;
  }
  if (node->next != (sx__coro_state *)0x0) {
    node->next->prev = node->prev;
  }
  if (*pfirst == node) {
    *pfirst = node->next;
  }
  if (*plast == node) {
    *plast = node->prev;
  }
  node->next = (sx__coro_state *)0x0;
  node->prev = (sx__coro_state *)0x0;
  return;
}

Assistant:

static inline void sx__coro_remove_list(sx__coro_state** pfirst, sx__coro_state** plast,
                                        sx__coro_state* node)
{
    if (node->prev)
        node->prev->next = node->next;
    if (node->next)
        node->next->prev = node->prev;
    if (*pfirst == node)
        *pfirst = node->next;
    if (*plast == node)
        *plast = node->prev;
    node->prev = node->next = NULL;
}